

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btWheelInfo.cpp
# Opt level: O3

void __thiscall
btWheelInfo::updateWheel(btWheelInfo *this,btRigidBody *chassis,RaycastInfo *raycastInfo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if ((this->m_raycastInfo).m_isInContact == true) {
    fVar1 = (this->m_raycastInfo).m_contactNormalWS.m_floats[0];
    fVar2 = (this->m_raycastInfo).m_contactNormalWS.m_floats[1];
    fVar3 = (this->m_raycastInfo).m_contactNormalWS.m_floats[2];
    fVar9 = (this->m_raycastInfo).m_wheelDirectionWS.m_floats[2] * fVar3 +
            (this->m_raycastInfo).m_wheelDirectionWS.m_floats[0] * fVar1 +
            (this->m_raycastInfo).m_wheelDirectionWS.m_floats[1] * fVar2;
    if (-0.1 <= fVar9) {
      this->m_suspensionRelativeVelocity = 0.0;
      bVar8 = 10.0;
    }
    else {
      fVar11 = (this->m_raycastInfo).m_contactPointWS.m_floats[1] -
               (chassis->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
      fVar10 = (this->m_raycastInfo).m_contactPointWS.m_floats[0] -
               (chassis->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
      fVar4 = (chassis->m_angularVelocity).m_floats[0];
      fVar5 = (chassis->m_angularVelocity).m_floats[1];
      fVar12 = (this->m_raycastInfo).m_contactPointWS.m_floats[2] -
               (chassis->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      fVar6 = (chassis->m_angularVelocity).m_floats[2];
      bVar8 = -1.0 / fVar9;
      this->m_suspensionRelativeVelocity =
           (fVar3 * ((fVar4 * fVar11 - fVar10 * fVar5) + (chassis->m_linearVelocity).m_floats[2]) +
           fVar1 * ((fVar5 * fVar12 - fVar11 * fVar6) + (chassis->m_linearVelocity).m_floats[0]) +
           fVar2 * ((fVar10 * fVar6 - fVar12 * fVar4) + (chassis->m_linearVelocity).m_floats[1])) *
           bVar8;
    }
  }
  else {
    (this->m_raycastInfo).m_suspensionLength = this->m_suspensionRestLength1;
    this->m_suspensionRelativeVelocity = 0.0;
    auVar7._8_4_ = -(this->m_raycastInfo).m_wheelDirectionWS.m_floats[2];
    auVar7._0_8_ = *(ulong *)(this->m_raycastInfo).m_wheelDirectionWS.m_floats ^ 0x8000000080000000;
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_raycastInfo).m_contactNormalWS.m_floats = auVar7;
    bVar8 = 1.0;
  }
  this->m_clippedInvContactDotSuspension = bVar8;
  return;
}

Assistant:

void	btWheelInfo::updateWheel(const btRigidBody& chassis,RaycastInfo& raycastInfo)
{
	(void)raycastInfo;

	
	if (m_raycastInfo.m_isInContact)

	{
		btScalar	project= m_raycastInfo.m_contactNormalWS.dot( m_raycastInfo.m_wheelDirectionWS );
		btVector3	 chassis_velocity_at_contactPoint;
		btVector3 relpos = m_raycastInfo.m_contactPointWS - chassis.getCenterOfMassPosition();
		chassis_velocity_at_contactPoint = chassis.getVelocityInLocalPoint( relpos );
		btScalar projVel = m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );
		if ( project >= btScalar(-0.1))
		{
			m_suspensionRelativeVelocity = btScalar(0.0);
			m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / project;
			m_suspensionRelativeVelocity = projVel * inv;
			m_clippedInvContactDotSuspension = inv;
		}
		
	}

	else	// Not in contact : position wheel in a nice (rest length) position
	{
		m_raycastInfo.m_suspensionLength = this->getSuspensionRestLength();
		m_suspensionRelativeVelocity = btScalar(0.0);
		m_raycastInfo.m_contactNormalWS = -m_raycastInfo.m_wheelDirectionWS;
		m_clippedInvContactDotSuspension = btScalar(1.0);
	}
}